

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Worker::PrepareThread(Worker *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  WorkerThread *pWVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  undefined1 local_29;
  WorkerThread *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  anon_class_8_1_8991fb9c local_18;
  
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 == 0) {
    __assert_fail("!mutex_.try_lock()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x312,"void restincurl::Worker::PrepareThread()");
  }
  if ((this->abort_ == false) && (this->done_ == false)) {
    if ((this->thread_).
        super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_28 = (element_type *)0x0;
      local_18.this = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<restincurl::Worker::WorkerThread,std::allocator<restincurl::Worker::WorkerThread>,restincurl::Worker::PrepareThread()::_lambda()_1_>
                (&_Stack_20,&local_28,(allocator<restincurl::Worker::WorkerThread> *)&local_29,
                 &local_18);
      _Var2._M_pi = _Stack_20._M_pi;
      pWVar1 = local_28;
      local_28 = (WorkerThread *)0x0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->thread_).
                super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->thread_).
      super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pWVar1;
      (this->thread_).
      super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
    }
    if (this->abort_ == true) {
      __assert_fail("!abort_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,0x326,"void restincurl::Worker::PrepareThread()");
    }
    if (this->done_ == true) {
      __assert_fail("!done_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,0x327,"void restincurl::Worker::PrepareThread()");
    }
  }
  return;
}

Assistant:

void PrepareThread() {
            // Must only be called when the mutex_ is acquired!
            assert(!mutex_.try_lock());
            if (abort_ || done_) {
                return;
            }
            if (!thread_) {
                thread_ = std::make_shared<WorkerThread>([&] {
                    try {
                        RESTINCURL_LOG("Starting thread " << std::this_thread::get_id());
                        Init();
                        Run();
                        Clean();
                    } catch (const std::exception& ex) {
                        RESTINCURL_LOG("Worker: " << ex.what());
                    }
                    RESTINCURL_LOG("Exiting thread " << std::this_thread::get_id());

                    lock_t lock(mutex_);
                    thread_.reset();
                });
            }
            assert(!abort_);
            assert(!done_);
        }